

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VirtualAllocWrapper.cpp
# Opt level: O0

LPVOID __thiscall
Memory::PreReservedVirtualAllocWrapper::GetPreReservedEndAddress
          (PreReservedVirtualAllocWrapper *this)

{
  code *pcVar1;
  bool bVar2;
  LPVOID pvVar3;
  undefined8 *in_FS_OFFSET;
  PreReservedVirtualAllocWrapper *this_local;
  
  bVar2 = IsPreReservedRegionPresent(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/VirtualAllocWrapper.cpp"
                       ,0xb7,"(IsPreReservedRegionPresent())","IsPreReservedRegionPresent()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  pvVar3 = GetPreReservedEndAddress(this->preReservedStartAddress);
  return pvVar3;
}

Assistant:

LPVOID
PreReservedVirtualAllocWrapper::GetPreReservedEndAddress()
{
    Assert(IsPreReservedRegionPresent());
    return GetPreReservedEndAddress(preReservedStartAddress);
}